

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void transpose64(word *A)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  word m;
  ulong uVar6;
  
  uVar6 = 0xffffffff;
  uVar3 = 0x20;
  do {
    uVar4 = 0;
    do {
      uVar1 = A[(int)(uVar4 + uVar3)];
      uVar5 = (uVar1 >> (sbyte)uVar3 ^ A[(int)uVar4]) & uVar6;
      A[(int)uVar4] = A[(int)uVar4] ^ uVar5;
      A[(int)(uVar4 + uVar3)] = uVar5 << (sbyte)uVar3 ^ uVar1;
      uVar4 = uVar4 + uVar3 + 1 & ~uVar3;
    } while ((int)uVar4 < 0x40);
    uVar6 = uVar6 ^ uVar6 << (sbyte)(uVar3 >> 1);
    bVar2 = 1 < uVar3;
    uVar3 = uVar3 >> 1;
  } while (bVar2);
  return;
}

Assistant:

void transpose64( word A[64] )
{
    int j, k;
    word t, m = 0x00000000FFFFFFFF;
    for ( j = 32; j != 0; j = j >> 1, m = m ^ (m << j) )
    {
        for ( k = 0; k < 64; k = (k + j + 1) & ~j )
        {
            t = (A[k] ^ (A[k+j] >> j)) & m;
            A[k] = A[k] ^ t;
            A[k+j] = A[k+j] ^ (t << j);
        }
    }
}